

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::AnimationCurveNode::AnimationCurveNode
          (AnimationCurveNode *this,uint64_t id,Element *element,string *name,Document *doc,
          char **target_prop_whitelist,size_t whitelist_size)

{
  _Rb_tree_header *p_Var1;
  Connection *this_00;
  char *__s1;
  int iVar2;
  Object *pOVar3;
  range_error *this_01;
  size_t i;
  size_t sVar4;
  pointer ppCVar5;
  allocator<char> local_d1;
  AnimationCurveNode *local_d0;
  Element *local_c8;
  string *local_c0;
  Object **local_b8;
  string *local_b0;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> local_a8;
  string local_98;
  Scope *local_78;
  Document *local_70;
  pointer local_68;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_60;
  char *whitelist [3];
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurveNode_00821a90;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->curves)._M_t._M_impl.super__Rb_tree_header;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->target = (Object *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->prop)._M_dataplus._M_p = (pointer)&(this->prop).field_2;
  (this->prop)._M_string_length = 0;
  local_c0 = (string *)&this->prop;
  (this->prop).field_2._M_local_buf[0] = '\0';
  this->doc = doc;
  local_c8 = element;
  local_78 = GetRequiredScope(element);
  whitelist[2] = "Deformer";
  whitelist[0] = "Model";
  whitelist[1] = "NodeAttribute";
  Document::GetConnectionsBySourceSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_60,doc,(this->super_Object).id,whitelist,3);
  local_b8 = &this->target;
  local_68 = local_60._M_impl.super__Vector_impl_data._M_finish;
  ppCVar5 = local_60._M_impl.super__Vector_impl_data._M_start;
  local_d0 = this;
  local_70 = doc;
  do {
    if (ppCVar5 == local_68) {
LAB_00531818:
      if (*local_b8 == (Object *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,
                   "failed to resolve target Model/NodeAttribute/Constraint for AnimationCurveNode",
                   (allocator<char> *)&local_a8);
        Util::DOMWarning(&local_98,local_c8);
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"AnimationCurveNode.FbxAnimCurveNode",&local_d1);
      Util::GetPropertyTable((Util *)&local_a8,doc,&local_98,local_c8,local_78,false);
      std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->props).
                  super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
                 &local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      std::__cxx11::string::~string((string *)&local_98);
      std::
      _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~_Vector_base(&local_60);
      return;
    }
    this_00 = *ppCVar5;
    if ((this_00->prop)._M_string_length != 0) {
      local_b0 = &this_00->prop;
      if (target_prop_whitelist != (char **)0x0) {
        __s1 = (local_b0->_M_dataplus)._M_p;
        sVar4 = 0;
        do {
          if (whitelist_size == sVar4) {
            this_01 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error
                      (this_01,"AnimationCurveNode target property is not in whitelist");
            __cxa_throw(this_01,&std::range_error::typeinfo,std::range_error::~range_error);
          }
          iVar2 = strcmp(__s1,target_prop_whitelist[sVar4]);
          sVar4 = sVar4 + 1;
        } while (iVar2 != 0);
      }
      pOVar3 = Connection::DestinationObject(this_00);
      doc = local_70;
      this = local_d0;
      if (pOVar3 != (Object *)0x0) {
        *local_b8 = pOVar3;
        std::__cxx11::string::_M_assign(local_c0);
        goto LAB_00531818;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,
                 "failed to read destination object for AnimationCurveNode->Model link, ignoring",
                 (allocator<char> *)&local_a8);
      Util::DOMWarning(&local_98,local_c8);
      std::__cxx11::string::~string((string *)&local_98);
    }
    ppCVar5 = ppCVar5 + 1;
  } while( true );
}

Assistant:

AnimationCurveNode::AnimationCurveNode(uint64_t id, const Element& element, const std::string& name, 
        const Document& doc, const char* const * target_prop_whitelist /*= NULL*/, 
        size_t whitelist_size /*= 0*/)
: Object(id, element, name)
, target()
, doc(doc)
{
    const Scope& sc = GetRequiredScope(element);

    // find target node
    const char* whitelist[] = {"Model","NodeAttribute","Deformer"};
    const std::vector<const Connection*>& conns = doc.GetConnectionsBySourceSequenced(ID(),whitelist,3);

    for(const Connection* con : conns) {

        // link should go for a property
        if (!con->PropertyName().length()) {
            continue;
        }

        if(target_prop_whitelist) {
            const char* const s = con->PropertyName().c_str();
            bool ok = false;
            for (size_t i = 0; i < whitelist_size; ++i) {
                if (!strcmp(s, target_prop_whitelist[i])) {
                    ok = true;
                    break;
                }
            }

            if (!ok) {
                throw std::range_error("AnimationCurveNode target property is not in whitelist");
            }
        }

        const Object* const ob = con->DestinationObject();
        if(!ob) {
            DOMWarning("failed to read destination object for AnimationCurveNode->Model link, ignoring",&element);
            continue;
        }

        // XXX support constraints as DOM class
        //ai_assert(dynamic_cast<const Model*>(ob) || dynamic_cast<const NodeAttribute*>(ob));
        target = ob;
        if(!target) {
            continue;
        }

        prop = con->PropertyName();
        break;
    }

    if(!target) {
        DOMWarning("failed to resolve target Model/NodeAttribute/Constraint for AnimationCurveNode",&element);
    }

    props = GetPropertyTable(doc,"AnimationCurveNode.FbxAnimCurveNode",element,sc,false);
}